

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QList<QWidgetItemData>_>::insert
          (QMovableArrayOps<QList<QWidgetItemData>_> *this,qsizetype i,qsizetype n,parameter_type t)

{
  uint uVar1;
  undefined8 in_RCX;
  GrowthPosition where;
  QArrayDataPointer<QList<QWidgetItemData>_> *in_RDX;
  long in_RSI;
  QArrayDataPointer<QList<QWidgetItemData>_> *in_RDI;
  long in_FS_OFFSET;
  bool bVar2;
  GrowthPosition pos;
  bool growsAtBegin;
  QList<QWidgetItemData> copy;
  QList<QWidgetItemData> *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar4;
  QArrayDataPointer<QList<QWidgetItemData>_> *pQVar5;
  Inserter local_48;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RCX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QWidgetItemData>::QList((QList<QWidgetItemData> *)in_RDI,in_stack_ffffffffffffff78);
  bVar2 = in_RDI->size != 0;
  uVar3 = bVar2 && in_RSI == 0;
  uVar4 = CONCAT13(uVar3,(int3)in_stack_ffffffffffffff94);
  uVar1 = (uint)(bVar2 && in_RSI == 0);
  QArrayDataPointer<QList<QWidgetItemData>_>::detachAndGrow
            (in_RDX,where,CONCAT44(uVar4,uVar1),
             (QList<QWidgetItemData> **)CONCAT17(uVar3,in_stack_ffffffffffffff88),in_RDI);
  if ((uVar4 & 0x1000000) == 0) {
    Inserter::Inserter((Inserter *)CONCAT44(uVar4,uVar1),
                       (QArrayDataPointer<QList<QWidgetItemData>_> *)
                       CONCAT17(uVar3,in_stack_ffffffffffffff88),(qsizetype)in_RDI,
                       (qsizetype)in_stack_ffffffffffffff78);
    Inserter::insertFill
              ((Inserter *)CONCAT44(uVar4,uVar1),
               (QList<QWidgetItemData> *)CONCAT17(uVar3,in_stack_ffffffffffffff88),(qsizetype)in_RDI
              );
    Inserter::~Inserter(&local_48);
  }
  else {
    while (pQVar5 = (QArrayDataPointer<QList<QWidgetItemData>_> *)((long)&in_RDX[-1].size + 7),
          in_RDX != (QArrayDataPointer<QList<QWidgetItemData>_> *)0x0) {
      QArrayDataPointer<QList<QWidgetItemData>_>::begin
                ((QArrayDataPointer<QList<QWidgetItemData>_> *)0x923230);
      QList<QWidgetItemData>::QList((QList<QWidgetItemData> *)in_RDI,in_stack_ffffffffffffff78);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      in_RDX = pQVar5;
    }
  }
  QList<QWidgetItemData>::~QList((QList<QWidgetItemData> *)0x9232a3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }